

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_0::verifyImageYellowGreen(Surface *image,TestLog *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this;
  uint uVar2;
  void *pvVar3;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar4;
  int __fd;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  Surface error;
  string local_358;
  string local_338;
  string local_318;
  Surface local_2f8;
  LogImageSet local_2e0;
  string local_2a0;
  string local_280;
  string local_260;
  LogImage local_240;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  tcu::Surface::Surface(&local_2f8,image->m_width,image->m_height);
  iVar7 = image->m_height;
  __fd = (int)log;
  if (0 < iVar7) {
    pvVar3 = (image->m_pixels).m_ptr;
    iVar6 = image->m_width;
    bVar4 = true;
    iVar5 = 0;
    do {
      if (0 < iVar6) {
        iVar7 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar3 + (long)(iVar6 * iVar5 + iVar7) * 4);
          bVar9 = (~(uVar2 >> 8) & 0xff) < 0x15;
          bVar10 = (uVar2 & 0xff0000) < 0x140001;
          uVar8 = 0xff0000ff;
          if (bVar10 && bVar9) {
            uVar8 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_2f8.m_pixels.m_ptr + (long)(local_2f8.m_width * iVar5 + iVar7) * 4) = uVar8;
          bVar4 = (bool)(bVar4 & (bVar10 && bVar9));
          iVar7 = iVar7 + 1;
          iVar6 = image->m_width;
        } while (iVar7 < iVar6);
        iVar7 = image->m_height;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar7);
    if (!bVar4) {
      this = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Image verification failed.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Verfication result","");
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Result of rendering","")
      ;
      tcu::LogImageSet::LogImageSet(&local_2e0,&local_358,&local_318);
      tcu::TestLog::startImageSet
                (log,local_2e0.m_name._M_dataplus._M_p,local_2e0.m_description._M_dataplus._M_p);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Result","");
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Result","");
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,&local_338,&local_260,image,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)image);
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ErrorMask","");
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Error mask","");
      surface = &local_2f8;
      tcu::LogImage::LogImage
                (&local_240,&local_280,&local_2a0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,__fd,__buf_01,(size_t)surface);
      tcu::TestLog::endImageSet(log);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != local_180) {
        operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.m_description._M_dataplus._M_p != &local_2e0.m_description.field_2) {
        operator_delete(local_2e0.m_description._M_dataplus._M_p,
                        local_2e0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.m_name._M_dataplus._M_p != &local_2e0.m_name.field_2) {
        operator_delete(local_2e0.m_name._M_dataplus._M_p,
                        local_2e0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
      goto LAB_00386af3;
    }
  }
  paVar1 = &local_2e0.m_name.field_2;
  local_2e0.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Verfication result","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Result of rendering","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2e0.m_name,&local_358);
  tcu::TestLog::startImageSet
            (log,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Result","");
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Result","");
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_318,&local_338,image,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf,(size_t)image);
  tcu::TestLog::endImageSet(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0.m_name._M_dataplus._M_p,
                    local_2e0.m_name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = true;
LAB_00386af3:
  tcu::Surface::~Surface(&local_2f8);
  return bVar4;
}

Assistant:

static bool verifyImageYellowGreen (const tcu::Surface& image, tcu::TestLog& log)
{
	using tcu::TestLog;

	const int colorThreshold	= 20;

	tcu::Surface error			(image.getWidth(), image.getHeight());
	bool isOk					= true;

	for (int y = 0; y < image.getHeight(); y++)
	for (int x = 0; x < image.getWidth(); x++)
	{
		const tcu::RGBA pixel = image.getPixel(x, y);
		bool pixelOk = true;

		// Any pixel with !(G ~= 255) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getGreen() - 255) > colorThreshold)
			pixelOk = false;

		// Any pixel with !(B ~= 0) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getBlue() - 0) > colorThreshold)
			pixelOk = false;

		error.setPixel(x, y, (pixelOk) ? (tcu::RGBA(0, 255, 0, 255)) : (tcu::RGBA(255, 0, 0, 255)));
		isOk = isOk && pixelOk;
	}

	if (!isOk)
	{
		log << TestLog::Message << "Image verification failed." << TestLog::EndMessage;
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result",		"Result",		image)
			<< TestLog::Image("ErrorMask",	"Error mask",	error)
			<< TestLog::EndImageSet;
	}
	else
	{
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result", "Result", image)
			<< TestLog::EndImageSet;
	}

	return isOk;
}